

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

bool __thiscall
duckdb::Bit::TryGetBitStringSize(Bit *this,string_t str,idx_t *str_len,string *error_message)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  char *pcVar2;
  allocator local_81;
  string error;
  string local_60;
  string local_40 [32];
  string_t str_local;
  
  str_local.value.pointer.ptr = str.value._0_8_;
  pcVar2 = str.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar2 = str_local.value.pointer.prefix;
  }
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    *str.value._8_8_ = (ulong)params;
    str_local.value._0_8_ = this;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((ulong)this & 0xffffffff) == params) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((ulong)this & 0xffffffff) ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::__cxx11::string::string((string *)&error,"Cannot cast empty string to BIT",&local_81)
        ;
        HandleCastError::AssignError(&error,(string *)str_len,(optional_idx)0xffffffffffffffff);
LAB_012a1eb2:
        ::std::__cxx11::string::~string((string *)&error);
        bVar1 = false;
      }
      else {
        *str.value._8_8_ = (((ulong)this >> 3 & 0x1fffffff) - (ulong)(((ulong)this & 7) == 0)) + 2;
        bVar1 = true;
      }
      return bVar1;
    }
    if ((*pcVar2 & 0xfeU) != 0x30) {
      ::std::__cxx11::string::string
                (local_40,"Invalid character encountered in string -> bit conversion: \'%s\'",
                 &local_81);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar2,pcVar2 + 1);
      StringUtil::Format<std::__cxx11::string>(&error,(StringUtil *)local_40,&local_60,params);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string(local_40);
      HandleCastError::AssignError(&error,(string *)str_len,(optional_idx)0xffffffffffffffff);
      goto LAB_012a1eb2;
    }
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(params->_M_dataplus)._M_p + 1);
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

bool Bit::TryGetBitStringSize(string_t str, idx_t &str_len, string *error_message) {
	auto data = const_data_ptr_cast(str.GetData());
	auto len = str.GetSize();
	str_len = 0;
	for (idx_t i = 0; i < len; i++) {
		if (data[i] == '0' || data[i] == '1') {
			str_len++;
		} else {
			string error = StringUtil::Format("Invalid character encountered in string -> bit conversion: '%s'",
			                                  string(const_char_ptr_cast(data) + i, 1));
			HandleCastError::AssignError(error, error_message);
			return false;
		}
	}
	if (str_len == 0) {
		string error = "Cannot cast empty string to BIT";
		HandleCastError::AssignError(error, error_message);
		return false;
	}
	str_len = ComputeBitstringLen(str_len);
	return true;
}